

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O1

void __thiscall
chaiscript::ChaiScript_Basic::build_eval_system
          (ChaiScript_Basic *this,ModulePtr *t_lib,
          vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *t_opts)

{
  Dispatch_Engine *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Module *this_01;
  __normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
  _Var2;
  Proxy_Function local_58;
  string local_48;
  anon_class_8_1_8991fb9c_for_m_f local_28;
  
  this_01 = (t_lib->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (this_01 != (Module *)0x0) {
    Module::apply<chaiscript::ChaiScript_Basic,chaiscript::detail::Dispatch_Engine>
              (this_01,this,&this->m_engine);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda()_1_,false,false,false,true,void>
            (&local_58);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"dump_system","");
  this_00 = &this->m_engine;
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Boxed_Value_const&)_1_,false,false,false,true,void,chaiscript::Boxed_Value_const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"dump_object","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Boxed_Value_const&,std::__cxx11::string_const&)_1_,false,false,false,true,bool,chaiscript::Boxed_Value_const&,std::__cxx11::string_const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"is_type","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Boxed_Value_const&)_2_,false,false,false,true,std::__cxx11::string,chaiscript::Boxed_Value_const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"type_name","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_1_,false,false,false,true,bool,std::__cxx11::string_const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"function_exists","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda()_2_,false,false,false,true,std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"get_functions","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda()_3_,false,false,false,true,std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"get_objects","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Function_Params_const&)_1_>,chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Function_Params_const&)_1_>
            ((chaiscript *)&local_58,&local_28);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"call_exists","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::dispatch::Proxy_Function_Base_const&,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)_1_,false,false,false,true,chaiscript::Boxed_Value,chaiscript::dispatch::Proxy_Function_Base_const&,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"call","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Type_Info_const&)_1_,false,false,false,true,std::__cxx11::string,chaiscript::Type_Info_const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"name","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&,bool)_1_,false,false,false,true,chaiscript::Type_Info,std::__cxx11::string_const&,bool>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"type","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_2_,false,false,false,true,chaiscript::Type_Info,std::__cxx11::string_const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"type","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Type_Info_const&,chaiscript::Type_Info_const&,std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>const&)_1_,false,false,false,true,void,chaiscript::Type_Info_const&,chaiscript::Type_Info_const&,std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"add_type_conversion","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_48._M_dataplus._M_p = local_48._M_dataplus._M_p & 0xffffffff00000000;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<chaiscript::Options_const*,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>>,__gnu_cxx::__ops::_Iter_equals_val<chaiscript::Options_const>>
                    ((t_opts->
                     super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>).
                     _M_impl.super__Vector_impl_data._M_start,
                     (t_opts->
                     super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>).
                     _M_impl.super__Vector_impl_data._M_finish);
  if (_Var2._M_current ==
      (t_opts->super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_58.
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ._0_4_ = 1;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<chaiscript::Options_const*,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>>,__gnu_cxx::__ops::_Iter_equals_val<chaiscript::Options_const>>
                      ((t_opts->
                       super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (_Var2._M_current !=
        (t_opts->super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      local_28.this = this;
      dispatch::detail::
      make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_,false,false,false,true,void,std::__cxx11::string_const&,std::__cxx11::string_const&>
                (&local_58);
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"load_module","");
      detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (local_58.
          super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.
                   super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_28.this = this;
      dispatch::detail::
      make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_3_,false,false,false,true,std::__cxx11::string,std::__cxx11::string_const&>
                (&local_58);
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"load_module","");
      detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (local_58.
          super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.
                   super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
  }
  local_48._M_dataplus._M_p._0_4_ = 2;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<chaiscript::Options_const*,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>>,__gnu_cxx::__ops::_Iter_equals_val<chaiscript::Options_const>>
                    ((t_opts->
                     super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>).
                     _M_impl.super__Vector_impl_data._M_start,
                     (t_opts->
                     super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>).
                     _M_impl.super__Vector_impl_data._M_finish);
  if (_Var2._M_current ==
      (t_opts->super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_58.
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ._0_4_ = 3;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<chaiscript::Options_const*,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>>,__gnu_cxx::__ops::_Iter_equals_val<chaiscript::Options_const>>
                      ((t_opts->
                       super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (_Var2._M_current !=
        (t_opts->super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      local_28.this = this;
      dispatch::detail::
      make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_4_,false,false,false,true,chaiscript::Boxed_Value,std::__cxx11::string_const&>
                (&local_58);
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"use","");
      detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (local_58.
          super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.
                   super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_28.this = this;
      dispatch::detail::
      make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_5_,false,false,false,true,chaiscript::Boxed_Value,std::__cxx11::string_const&>
                (&local_58);
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"eval_file","");
      detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (local_58.
          super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.
                   super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_6_,false,false,false,true,chaiscript::Boxed_Value,std::__cxx11::string_const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"eval","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::AST_Node_const&)_1_,false,false,false,true,chaiscript::Boxed_Value,chaiscript::AST_Node_const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"eval","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&,bool)_2_,false,false,false,true,std::unique_ptr<chaiscript::AST_Node,std::default_delete<chaiscript::AST_Node>>,std::__cxx11::string_const&,bool>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"parse","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_7_,false,false,false,true,std::unique_ptr<chaiscript::AST_Node,std::default_delete<chaiscript::AST_Node>>,std::__cxx11::string_const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"parse","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Boxed_Value_const&,std::__cxx11::string_const&)_2_,false,false,false,true,void,chaiscript::Boxed_Value_const&,std::__cxx11::string_const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"add_global_const","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Boxed_Value_const&,std::__cxx11::string_const&)_3_,false,false,false,true,void,chaiscript::Boxed_Value_const&,std::__cxx11::string_const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"add_global","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Boxed_Value_const&,std::__cxx11::string_const&)_4_,false,false,false,true,void,chaiscript::Boxed_Value_const&,std::__cxx11::string_const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"set_global","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_8_,false,false,false,true,void,std::__cxx11::string_const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"namespace","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_28.this = this;
  dispatch::detail::
  make_callable_impl<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_9_,false,false,false,true,void,std::__cxx11::string_const&>
            (&local_58);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"import","");
  detail::Dispatch_Engine::add_function(this_00,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void build_eval_system(const ModulePtr &t_lib, const std::vector<Options> &t_opts) {
      if (t_lib) {
        add(t_lib);
      }

      m_engine.add(fun([this]() { m_engine.dump_system(); }), "dump_system");
      m_engine.add(fun([this](const Boxed_Value &t_bv) { m_engine.dump_object(t_bv); }), "dump_object");
      m_engine.add(fun([this](const Boxed_Value &t_bv, const std::string &t_type) { return m_engine.is_type(t_bv, t_type); }), "is_type");
      m_engine.add(fun([this](const Boxed_Value &t_bv) { return m_engine.type_name(t_bv); }), "type_name");
      m_engine.add(fun([this](const std::string &t_f) { return m_engine.function_exists(t_f); }), "function_exists");
      m_engine.add(fun([this]() { return m_engine.get_function_objects(); }), "get_functions");
      m_engine.add(fun([this]() { return m_engine.get_scripting_objects(); }), "get_objects");

      m_engine.add(dispatch::make_dynamic_proxy_function([this](const Function_Params &t_params) { return m_engine.call_exists(t_params); }),
                   "call_exists");

      m_engine.add(fun([this](const dispatch::Proxy_Function_Base &t_fun, const std::vector<Boxed_Value> &t_params) -> Boxed_Value {
                     Type_Conversions_State s(this->m_engine.conversions(), this->m_engine.conversions().conversion_saves());
                     return t_fun(Function_Params{t_params}, s);
                   }),
                   "call");

      m_engine.add(fun([this](const Type_Info &t_ti) { return m_engine.get_type_name(t_ti); }), "name");

      m_engine.add(fun([this](const std::string &t_type_name, bool t_throw) { return m_engine.get_type(t_type_name, t_throw); }), "type");
      m_engine.add(fun([this](const std::string &t_type_name) { return m_engine.get_type(t_type_name, true); }), "type");

      m_engine.add(fun([this](const Type_Info &t_from, const Type_Info &t_to, const std::function<Boxed_Value(const Boxed_Value &)> &t_func) {
                     m_engine.add(chaiscript::type_conversion(t_from, t_to, t_func));
                   }),
                   "add_type_conversion");

      if (std::find(t_opts.begin(), t_opts.end(), Options::No_Load_Modules) == t_opts.end()
          && std::find(t_opts.begin(), t_opts.end(), Options::Load_Modules) != t_opts.end()) {
        m_engine.add(fun([this](const std::string &t_module, const std::string &t_file) { load_module(t_module, t_file); }), "load_module");
        m_engine.add(fun([this](const std::string &t_module) { return load_module(t_module); }), "load_module");
      }

      if (std::find(t_opts.begin(), t_opts.end(), Options::No_External_Scripts) == t_opts.end()
          && std::find(t_opts.begin(), t_opts.end(), Options::External_Scripts) != t_opts.end()) {
        m_engine.add(fun([this](const std::string &t_file) { return use(t_file); }), "use");
        m_engine.add(fun([this](const std::string &t_file) { return internal_eval_file(t_file); }), "eval_file");
      }

      m_engine.add(fun([this](const std::string &t_str) { return internal_eval(t_str); }), "eval");
      m_engine.add(fun([this](const AST_Node &t_ast) { return eval(t_ast); }), "eval");

      m_engine.add(fun([this](const std::string &t_str, const bool t_dump) { return parse(t_str, t_dump); }), "parse");
      m_engine.add(fun([this](const std::string &t_str) { return parse(t_str); }), "parse");

      m_engine.add(fun([this](const Boxed_Value &t_bv, const std::string &t_name) { add_global_const(t_bv, t_name); }), "add_global_const");
      m_engine.add(fun([this](const Boxed_Value &t_bv, const std::string &t_name) { add_global(t_bv, t_name); }), "add_global");
      m_engine.add(fun([this](const Boxed_Value &t_bv, const std::string &t_name) { set_global(t_bv, t_name); }), "set_global");

      // why this unused parameter to Namespace?
      m_engine.add(fun([this](const std::string &t_namespace_name) {
                     register_namespace([](Namespace & /*space*/) noexcept {}, t_namespace_name);
                     import(t_namespace_name);
                   }),
                   "namespace");
      m_engine.add(fun([this](const std::string &t_namespace_name) { import(t_namespace_name); }), "import");
    }